

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeIsExor(Abc_Obj_t *pNode)

{
  Hop_Man_t *p;
  Hop_Obj_t *pObj;
  int iVar1;
  word wVar2;
  word Truth;
  Hop_Man_t *pMan;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  if ((iVar1 < 3) || (iVar1 = Abc_ObjFaninNum(pNode), 6 < iVar1)) {
    return 0;
  }
  p = (Hop_Man_t *)pNode->pNtk->pManFunc;
  pObj = (Hop_Obj_t *)(pNode->field_5).pData;
  iVar1 = Abc_ObjFaninNum(pNode);
  wVar2 = Hop_ManComputeTruth6(p,pObj,iVar1);
  if (((wVar2 != 0x6666666666666666) &&
      ((((wVar2 != 0x9999999999999999 && (wVar2 != 0x9696969696969696)) &&
        (wVar2 != 0x6969696969696969)) &&
       ((wVar2 != 0x6996699669966996 && (wVar2 != 0x9669966996699669)))))) &&
     ((wVar2 != 0x9669699696696996 &&
      (((wVar2 != 0x6996966969969669 && (wVar2 != 0x6996966996696996)) &&
       (wVar2 != 0x9669699669969669)))))) {
    return 0;
  }
  return 1;
}

Assistant:

int Abc_NodeIsExor( Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan;
    word Truth;
    if ( Abc_ObjFaninNum(pNode) < 3 || Abc_ObjFaninNum(pNode) > 6 )
        return 0;
    pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    Truth = Hop_ManComputeTruth6( pMan, (Hop_Obj_t *)pNode->pData, Abc_ObjFaninNum(pNode) );
    if ( Truth == 0x6666666666666666 || Truth == 0x9999999999999999 || 
         Truth == 0x9696969696969696 || Truth == 0x6969696969696969 || 
         Truth == 0x6996699669966996 || Truth == 0x9669966996699669 || 
         Truth == 0x9669699696696996 || Truth == 0x6996966969969669 ||
         Truth == 0x6996966996696996 || Truth == 0x9669699669969669 )
         return 1;
    return 0;
}